

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O2

void __thiscall kj::Exception::truncateCommonTrace(Exception *this)

{
  uint uVar1;
  uint in_ECX;
  uint uVar2;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  uint j;
  ulong uVar11;
  bool bVar12;
  ArrayPtr<void_*const> AVar13;
  void *refTraceSpace [36];
  int iVar3;
  
  if (this->traceCount != 0) {
    AVar13 = getStackTrace((kj *)refTraceSpace,(ArrayPtr<void_*>)ZEXT816(0x24),in_ECX);
    uVar4 = AVar13.size_;
    uVar1 = this->traceCount;
    uVar6 = uVar4 >> 1;
    uVar8 = (uint)AVar13.size_;
    lVar7 = -(ulong)uVar8;
    while( true ) {
      uVar8 = uVar8 - 1;
      iVar3 = (int)uVar4;
      uVar2 = iVar3 - 1;
      uVar4 = (ulong)uVar2;
      if (iVar3 == 0) break;
      if (AVar13.ptr[uVar2] == this->trace[uVar1 - 1]) {
        uVar10 = (ulong)uVar1;
        uVar11 = 0;
        uVar2 = uVar8;
        while (uVar5 = (ulong)uVar2, lVar7 + uVar11 != 0) {
          if (uVar11 == uVar1) {
            uVar9 = 0;
            goto LAB_00177cb6;
          }
          uVar9 = (int)uVar10 - 1;
          uVar10 = (ulong)uVar9;
          bVar12 = uVar6 < uVar11;
          uVar11 = uVar11 + 1;
          uVar2 = uVar2 - 1;
          if (bVar12 && AVar13.ptr[uVar5] != this->trace[uVar10]) {
LAB_00177cb6:
            this->traceCount = uVar9;
            return;
          }
        }
      }
      lVar7 = lVar7 + 1;
    }
  }
  return;
}

Assistant:

void Exception::truncateCommonTrace() {
  if (traceCount > 0) {
    // Create a "reference" stack trace that is a little bit deeper than the one in the exception.
    void* refTraceSpace[sizeof(this->trace) / sizeof(this->trace[0]) + 4];
    auto refTrace = kj::getStackTrace(refTraceSpace, 0);

    // We expect that the deepest frame in the exception's stack trace should be somewhere in our
    // own trace, since our own trace has a deeper limit. Search for it.
    for (uint i = refTrace.size(); i > 0; i--) {
      if (refTrace[i-1] == trace[traceCount-1]) {
        // See how many frames match.
        for (uint j = 0; j < i; j++) {
          if (j >= traceCount) {
            // We matched the whole trace, apparently?
            traceCount = 0;
            return;
          } else if (refTrace[i-j-1] != trace[traceCount-j-1]) {
            // Found mismatching entry.

            // If we matched more than half of the reference trace, guess that this is in fact
            // the prefix we're looking for.
            if (j > refTrace.size() / 2) {
              // Delete the matching suffix. Also delete one non-matched entry on the assumption
              // that both traces contain that stack frame but are simply at different points in
              // the function.
              traceCount -= j + 1;
              return;
            }
          }
        }
      }
    }

    // No match. Ignore.
  }
}